

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * GenImageGradientH(Image *__return_storage_ptr__,int width,int height,Color left,Color right)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [11];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint6 uVar24;
  uint6 uVar25;
  undefined1 auVar26 [16];
  undefined4 *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined4 *puVar31;
  undefined4 *puVar32;
  ulong uVar33;
  bool bVar34;
  ushort uVar35;
  short sVar36;
  float fVar37;
  undefined1 auVar40 [16];
  float fVar41;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar38;
  undefined6 uVar39;
  
  puVar27 = (undefined4 *)malloc((long)(height * width) << 2);
  auVar26 = _DAT_00154940;
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),right.a);
  auVar20._9_6_ = 0;
  auVar20._0_9_ = Var14;
  auVar15._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar15[0] = right.b;
  auVar21._11_4_ = 0;
  auVar21._0_11_ = auVar15;
  auVar16._1_12_ = SUB1512(auVar21 << 0x20,3);
  auVar16[0] = right.g;
  uVar35 = CONCAT11(0,right.r);
  auVar13._2_13_ = auVar16;
  auVar13._0_2_ = uVar35;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar13._0_10_;
  auVar9._12_2_ = (short)Var14;
  uVar24 = CONCAT42(auVar9._10_4_,auVar15._0_2_);
  auVar17._6_8_ = 0;
  auVar17._0_6_ = uVar24;
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),left.a);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var14;
  auVar18._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar18[0] = left.b;
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar18;
  auVar11[2] = left.g;
  auVar11._0_2_ = left._0_2_;
  auVar11._3_12_ = SUB1512(auVar23 << 0x20,3);
  auVar12._2_13_ = auVar11._2_13_;
  auVar12._0_2_ = left._0_2_ & 0xff;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar12._0_10_;
  auVar8._12_2_ = (short)Var14;
  uVar25 = CONCAT42(auVar8._10_4_,auVar18._0_2_);
  auVar19._6_8_ = 0;
  auVar19._0_6_ = uVar25;
  auVar10._4_2_ = auVar11._2_2_;
  auVar10._0_4_ = auVar12._0_4_;
  auVar10._6_8_ = SUB148(auVar19 << 0x40,6);
  uVar28 = 0;
  uVar29 = 0;
  if (0 < height) {
    uVar29 = (ulong)(uint)height;
  }
  uVar30 = 0;
  puVar31 = puVar27;
  if (0 < width) {
    uVar30 = (ulong)(uint)width;
  }
  for (; uVar28 != uVar30; uVar28 = uVar28 + 1) {
    fVar37 = (float)(int)uVar28 / (float)width;
    fVar41 = 1.0 - fVar37;
    auVar40._0_4_ = (int)(fVar37 * (float)uVar35 + fVar41 * (float)(auVar12._0_4_ & 0xffff));
    auVar40._4_4_ =
         (int)(fVar37 * (float)(int)CONCAT82(SUB148(auVar17 << 0x40,6),auVar16._0_2_) +
              fVar41 * (float)auVar10._4_4_);
    auVar40._8_4_ = (int)(fVar37 * (float)(int)uVar24 + fVar41 * (float)(int)uVar25);
    auVar40._12_4_ =
         (int)(fVar37 * (float)(auVar9._10_4_ >> 0x10) + fVar41 * (float)(auVar8._10_4_ >> 0x10));
    auVar40 = auVar40 & auVar26;
    sVar5 = auVar40._0_2_;
    cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar40[0] - (0xff < sVar5);
    sVar5 = auVar40._2_2_;
    sVar36 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar40[2] - (0xff < sVar5),cVar1);
    sVar5 = auVar40._4_2_;
    cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar40[4] - (0xff < sVar5);
    sVar5 = auVar40._6_2_;
    uVar38 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar40[6] - (0xff < sVar5),
                      CONCAT12(cVar2,sVar36));
    sVar5 = auVar40._8_2_;
    cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar40[8] - (0xff < sVar5);
    sVar5 = auVar40._10_2_;
    uVar39 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar40[10] - (0xff < sVar5),
                      CONCAT14(cVar3,uVar38));
    sVar5 = auVar40._12_2_;
    cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar40[0xc] - (0xff < sVar5);
    sVar7 = auVar40._14_2_;
    sVar5 = (short)((uint)uVar38 >> 0x10);
    sVar6 = (short)((uint6)uVar39 >> 0x20);
    sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar40[0xe] - (0xff < sVar7),
                             CONCAT16(cVar4,uVar39)) >> 0x30);
    puVar32 = puVar31;
    uVar33 = uVar29;
    while (bVar34 = uVar33 != 0, uVar33 = uVar33 - 1, bVar34) {
      *puVar32 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                          CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                   CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                            (0 < sVar36) * (sVar36 < 0x100) * cVar1 -
                                            (0xff < sVar36))));
      puVar32 = puVar32 + width;
    }
    puVar31 = puVar31 + 1;
  }
  __return_storage_ptr__->data = puVar27;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientH(int width, int height, Color left, Color right)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width; i++)
    {
        float factor = (float)i/(float)width;
        for (int j = 0; j < height; j++)
        {
            pixels[j*width + i].r = (int)((float)right.r*factor + (float)left.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)right.g*factor + (float)left.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)right.b*factor + (float)left.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)right.a*factor + (float)left.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}